

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tts.cpp
# Opt level: O0

void fold(vector<float,_std::allocator<float>_> *data,int64_t n_out,int64_t n_win,int64_t n_hop,
         int64_t n_pad,vector<float,_std::allocator<float>_> *output)

{
  float fVar1;
  size_type sVar2;
  const_reference pvVar3;
  reference pvVar4;
  long in_RCX;
  long in_RDX;
  long in_RSI;
  vector<float,_std::allocator<float>_> *in_RDI;
  long in_R8;
  vector<float,_std::allocator<float>_> *in_R9;
  int64_t w_im;
  int64_t end;
  int64_t start;
  int64_t w_col;
  int64_t col_idx;
  int64_t width;
  int64_t stride_w;
  int64_t kernel_w;
  int64_t output_height;
  vector<float,_std::allocator<float>_> *local_80;
  size_type in_stack_ffffffffffffff88;
  vector<float,_std::allocator<float>_> *in_stack_ffffffffffffff90;
  size_type in_stack_ffffffffffffff98;
  long lVar5;
  vector<float,_std::allocator<float>_> *in_stack_ffffffffffffffa0;
  size_type sVar6;
  size_type __n;
  
  std::vector<float,_std::allocator<float>_>::resize
            (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,
             (value_type_conflict5 *)in_stack_ffffffffffffff90);
  sVar6 = 0;
  for (lVar5 = 0; lVar5 < in_RSI; lVar5 = lVar5 + 1) {
    local_80 = (vector<float,_std::allocator<float>_> *)(lVar5 * in_RCX - in_R8);
    in_stack_ffffffffffffff88 =
         (long)&(local_80->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                super__Vector_impl_data._M_start + in_RDX;
    in_stack_ffffffffffffff90 = local_80;
    for (; (long)local_80 < (long)in_stack_ffffffffffffff88;
        local_80 = (vector<float,_std::allocator<float>_> *)
                   ((long)&(local_80->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                           super__Vector_impl_data._M_start + 1)) {
      __n = sVar6;
      if ((-1 < (long)local_80) && ((long)local_80 < in_RSI)) {
        sVar2 = std::vector<float,_std::allocator<float>_>::size(in_RDI);
        if ((long)sVar6 < (long)sVar2) {
          pvVar3 = std::vector<float,_std::allocator<float>_>::operator[](in_RDI,__n);
          fVar1 = *pvVar3;
          pvVar4 = std::vector<float,_std::allocator<float>_>::operator[](in_R9,(size_type)local_80)
          ;
          *pvVar4 = fVar1 + *pvVar4;
        }
      }
      sVar6 = __n + 1;
    }
  }
  std::vector<float,_std::allocator<float>_>::resize
            (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  return;
}

Assistant:

static void fold(const std::vector<float> & data, int64_t n_out, int64_t n_win, int64_t n_hop, int64_t n_pad, std::vector<float> & output) {
    int64_t output_height = n_out;
    int64_t kernel_w = n_win;
    int64_t stride_w = n_hop;
    int64_t width    = n_out;

    output.resize(width, 0.0f);

    int64_t col_idx = 0;
    for (int64_t w_col = 0; w_col < width; ++w_col) {
        int64_t start = w_col * stride_w - n_pad;
        int64_t end   = start + kernel_w;

        for (int64_t w_im = start; w_im < end; ++w_im) {
            if (w_im >= 0 && w_im < output_height && col_idx < (int64_t) data.size()) {
                output[w_im] += data[col_idx];
            }
            col_idx++;
        }
    }

    output.resize(n_out - 2 * n_pad);
}